

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  ImVec2 IVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ImVec2 *pIVar10;
  ImU32 col;
  float fVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_78;
  ImDrawList *local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  ImVec2 local_40;
  float local_38;
  float local_34;
  undefined1 extraout_var [56];
  
  IVar1 = *pos_min;
  auVar15 = ZEXT416((uint)IVar1.x);
  local_78 = IVar1;
  local_70 = draw_list;
  if (text_size_if_known == (ImVec2 *)0x0) {
    fVar11 = GImGui->FontSize;
    if (text_display_end == text) {
      auVar13 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0x1d);
    }
    else {
      local_68 = ZEXT416((uint)IVar1.x);
      auVar12._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,fVar11,3.4028235e+38,0.0,text,text_display_end,(char **)0x0);
      auVar12._8_56_ = extraout_var;
      auVar15 = vcvtdq2ps_avx(ZEXT416((uint)(int)(auVar12._0_4_ + 0.95)));
      auVar13._4_12_ = auVar12._4_12_;
      auVar13._0_4_ = auVar15._0_4_;
      auVar15 = local_68;
    }
  }
  else {
    auVar13._8_8_ = 0;
    auVar13._0_4_ = text_size_if_known->x;
    auVar13._4_4_ = text_size_if_known->y;
  }
  fVar14 = auVar15._0_4_;
  fVar11 = IVar1.y;
  bVar2 = true;
  pIVar10 = pos_max;
  if (clip_rect != (ImRect *)0x0) {
    pos_min = &clip_rect->Min;
    pIVar10 = &clip_rect->Max;
  }
  auVar3 = vmovshdup_avx(auVar13);
  if (auVar13._0_4_ + fVar14 < pIVar10->x) {
    bVar2 = pIVar10->y <= auVar3._0_4_ + fVar11;
  }
  if (clip_rect != (ImRect *)0x0) {
    bVar5 = true;
    if ((clip_rect->Min).x <= fVar14) {
      bVar5 = fVar11 < (clip_rect->Min).y;
    }
    bVar2 = (bool)(bVar2 | bVar5);
  }
  if (0.0 < align->x) {
    auVar13 = vfmadd213ss_fma(ZEXT416((uint)align->x),
                              ZEXT416((uint)((pos_max->x - fVar14) - auVar13._0_4_)),auVar15);
    uVar4 = vcmpss_avx512f(auVar13,auVar15,2);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_78.x = (float)((uint)bVar5 * (int)fVar14 + (uint)!bVar5 * auVar13._0_4_);
  }
  if (0.0 < align->y) {
    auVar15 = vfmadd213ss_fma(ZEXT416((uint)align->y),
                              ZEXT416((uint)((pos_max->y - fVar11) - auVar3._0_4_)),
                              ZEXT416((uint)fVar11));
    uVar4 = vcmpss_avx512f(auVar15,ZEXT416((uint)fVar11),2);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_78.y = (float)((uint)bVar5 * (int)fVar11 + (uint)!bVar5 * auVar15._0_4_);
  }
  if (bVar2) {
    local_34 = pIVar10->y;
    local_40 = ((ImRect *)pos_min)->Min;
    cpu_fine_clip_rect = (ImVec4 *)&local_40;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar6 = (GImGui->Style).Colors[0].z;
    uVar7 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar7;
    local_58.z = (float)uVar6;
    local_38 = pIVar10->x;
    col = ColorConvertFloat4ToU32(&local_58);
  }
  else {
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar8 = (GImGui->Style).Colors[0].z;
    uVar9 = (GImGui->Style).Colors[0].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar9;
    local_58.z = (float)uVar8;
    col = ColorConvertFloat4ToU32(&local_58);
    cpu_fine_clip_rect = (ImVec4 *)0x0;
  }
  ImDrawList::AddText(local_70,(ImFont *)0x0,0.0,&local_78,col,text,text_display_end,0.0,
                      cpu_fine_clip_rect);
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}